

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_LengthValue *
ON_LengthValue::Create
          (ON_LengthValue *__return_storage_ptr__,double length_value,
          LengthUnitSystem length_unit_system,uint locale_id,StringFormat string_format)

{
  ON_UnitSystem local_38;
  
  ON_UnitSystem::ON_UnitSystem(&local_38,length_unit_system);
  Create(__return_storage_ptr__,length_value,&local_38,locale_id,string_format);
  ON_wString::~ON_wString(&local_38.m_custom_unit_name);
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::Create(
  double length_value,
  const ON::LengthUnitSystem length_unit_system,
  unsigned int locale_id,
  ON_LengthValue::StringFormat string_format
  //,  double clean_format_tolerance
)
{
  return ON_LengthValue::Create(
    length_value,
    ON_UnitSystem(length_unit_system),
    locale_id,
    string_format
    //,    clean_format_tolerance
  );
}